

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Student.cpp
# Opt level: O2

ostream * __thiscall L14_2::Student::output(Student *this,ostream *os)

{
  ulong uVar1;
  ostream *poVar2;
  
  uVar1 = (this->super_valarray<double>)._M_size;
  if ((int)uVar1 < 1) {
    std::operator<<(os,"empty array ");
  }
  if ((uVar1 & 0x7fffffff) != 0) {
    poVar2 = std::ostream::_M_insert<double>(*(this->super_valarray<double>)._M_data);
    std::operator<<(poVar2," ");
  }
  if ((int)((uVar1 & 0xffffffff) % 5) != 0) {
    std::endl<char,std::char_traits<char>>(os);
  }
  return os;
}

Assistant:

std::ostream& Student::output(std::ostream &os) const {
        int i;
        int size = NumberArray::size();
        if (size > 0) {
            for (i = 0; i < size; i++) {
                os << NumberArray::operator[](i) << " ";
                if (i % 5 == 4) {
                    os << std::endl;
                }
            }
            if (i % 5 != 0) {
                os << std::endl;
            }
        } else {
            os << "empty array ";
        }
        return os;
    }